

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::parseSettingsString
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,char *string)

{
  byte *__s1;
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  unsigned_long uVar5;
  SPxOut *pSVar6;
  ulong uVar7;
  Verbosity old_verbosity;
  Verbosity VVar8;
  byte *pbVar9;
  char *pcVar10;
  long lVar11;
  byte *pbVar12;
  undefined8 *puVar13;
  Verbosity old_verbosity_5;
  byte *__s1_00;
  byte *pbVar14;
  byte *__s1_01;
  allocator local_251;
  string local_250;
  Real local_230;
  char parseString [500];
  
  if (string == (char *)0x0) {
    return false;
  }
  spxSnprintf(parseString,499,"%s",string);
  pbVar12 = (byte *)parseString;
  do {
    pbVar12 = pbVar12 + 1;
    uVar7 = (ulong)pbVar12[-1];
    if (0x23 < uVar7) goto LAB_003a34fa;
  } while ((0x100002200U >> (uVar7 & 0x3f) & 1) != 0);
  if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) {
    return true;
  }
LAB_003a34fa:
  __s1 = pbVar12 + -1;
  __s1_00 = pbVar12;
  while (0x3a < (byte)uVar7) {
LAB_003a3521:
    bVar1 = *__s1_00;
    __s1_00 = __s1_00 + 1;
    uVar7 = (ulong)bVar1;
  }
  if ((0x900002601U >> (uVar7 & 0x3f) & 1) == 0) {
    if (uVar7 != 0x3a) goto LAB_003a3521;
    __s1_00[-1] = 0;
  }
  else {
    __s1_00[-1] = 0;
    pbVar14 = __s1_00;
    do {
      do {
        __s1_00 = pbVar14 + 1;
        bVar1 = *pbVar14;
        pbVar14 = __s1_00;
      } while (bVar1 == 9);
    } while ((bVar1 == 0xd) || (bVar1 == 0x20));
    if (bVar1 != 0x3a) {
      VVar8 = (this->spxout).m_verbosity;
      if ((int)VVar8 < 3) {
        return false;
      }
      pSVar6 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar10 = "Error parsing setting string: no \':\' separating parameter type and name.\n";
      goto LAB_003a35a0;
    }
  }
  for (; uVar7 = (ulong)*__s1_00, pbVar14 = __s1_00, uVar7 < 0x24; __s1_00 = __s1_00 + 1) {
    if ((0x100002200U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) {
        VVar8 = (this->spxout).m_verbosity;
        if ((int)VVar8 < 3) {
          return false;
        }
        pSVar6 = &this->spxout;
        (this->spxout).m_verbosity = INFO1;
        pcVar10 = "Error parsing setting string: no parameter name.\n";
        goto LAB_003a35a0;
      }
      break;
    }
  }
LAB_003a35c0:
  __s1_01 = pbVar14 + 1;
  if (0x3d < (byte)uVar7) goto LAB_003a35d6;
  if ((0x900002601U >> (uVar7 & 0x3f) & 1) == 0) {
    if (uVar7 != 0x3d) goto LAB_003a35d6;
    *pbVar14 = 0;
  }
  else {
    *pbVar14 = 0;
    pbVar14 = __s1_01;
    do {
      do {
        __s1_01 = pbVar14 + 1;
        bVar1 = *pbVar14;
        pbVar14 = __s1_01;
      } while (bVar1 == 9);
    } while ((bVar1 == 0xd) || (bVar1 == 0x20));
    if (bVar1 != 0x3d) {
      VVar8 = (this->spxout).m_verbosity;
      if ((int)VVar8 < 3) {
        return false;
      }
      pSVar6 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar10 = "Error parsing setting string: no \'=\' after parameter name.\n";
      goto LAB_003a35a0;
    }
  }
  goto LAB_003a3625;
LAB_003a35d6:
  uVar7 = (ulong)*__s1_01;
  pbVar14 = __s1_01;
  goto LAB_003a35c0;
LAB_003a3625:
  uVar7 = (ulong)*__s1_01;
  pbVar14 = __s1_01;
  if (0x23 < uVar7) goto LAB_003a366c;
  if ((0x100002200U >> (uVar7 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) {
      VVar8 = (this->spxout).m_verbosity;
      if ((int)VVar8 < 3) {
        return false;
      }
      pSVar6 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar10 = "Error parsing setting string: no parameter value.\n";
      goto LAB_003a35a0;
    }
    goto LAB_003a366c;
  }
  __s1_01 = __s1_01 + 1;
  goto LAB_003a3625;
LAB_003a366c:
  pbVar9 = pbVar14 + 1;
  if ((byte)uVar7 < 0x24) {
    if ((0x900002600U >> (uVar7 & 0x3f) & 1) != 0) {
      *pbVar14 = 0;
      goto LAB_003a368b;
    }
    if (uVar7 == 0) goto LAB_003a36ae;
  }
  uVar7 = (ulong)*pbVar9;
  pbVar14 = pbVar9;
  goto LAB_003a366c;
LAB_003a368b:
  uVar7 = (ulong)*pbVar9;
  if (0x23 < uVar7) {
LAB_003a37b7:
    VVar8 = (this->spxout).m_verbosity;
    if ((int)VVar8 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar6 = soplex::operator<<(&this->spxout,
                                "Error parsing setting string: additional character \'");
    pSVar6 = soplex::operator<<(pSVar6,*pbVar9);
    soplex::operator<<(pSVar6,"\' after parameter value.\n");
    (this->spxout).m_verbosity = VVar8;
    return false;
  }
  if ((0x100002200U >> (uVar7 & 0x3f) & 1) == 0) {
    if ((0x800000401U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_003a36ae;
    goto LAB_003a37b7;
  }
  pbVar9 = pbVar9 + 1;
  goto LAB_003a368b;
LAB_003a36ae:
  iVar3 = strncmp((char *)__s1,"bool",4);
  if (iVar3 == 0) {
    puVar13 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::Settings::boolParam;
    for (lVar11 = 0; lVar11 != 0x1a; lVar11 = lVar11 + 1) {
      iVar3 = strncmp((char *)__s1_00,(char *)*puVar13,500);
      if (iVar3 == 0) {
        iVar3 = strncasecmp((char *)__s1_01,"true",4);
        if ((((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"TRUE",4), iVar3 == 0)) ||
            (iVar3 = strncasecmp((char *)__s1_01,"t",4), iVar3 == 0)) ||
           ((iVar3 = strncasecmp((char *)__s1_01,"T",4), iVar3 == 0 ||
            (lVar4 = strtol((char *)__s1_01,(char **)0x0,4), lVar4 == 1)))) {
          bVar2 = true;
LAB_003a38cf:
          bVar2 = setBoolParam(this,(BoolParam)lVar11,bVar2,true);
          if (bVar2) {
            return true;
          }
        }
        else {
          iVar3 = strncasecmp((char *)__s1_01,"false",5);
          if (((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1_01,"FALSE",5), iVar3 == 0)) ||
             ((iVar3 = strncasecmp((char *)__s1_01,"f",5), iVar3 == 0 ||
              ((iVar3 = strncasecmp((char *)__s1_01,"F",5), iVar3 == 0 ||
               (lVar4 = strtol((char *)__s1_01,(char **)0x0,5), lVar4 == 0)))))) {
            bVar2 = false;
            goto LAB_003a38cf;
          }
        }
        VVar8 = (this->spxout).m_verbosity;
        if ((int)VVar8 < 3) {
          return false;
        }
        (this->spxout).m_verbosity = INFO1;
        pSVar6 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <");
        pSVar6 = soplex::operator<<(pSVar6,(char *)__s1_01);
        pcVar10 = "> for bool parameter <";
        goto LAB_003a3ad2;
      }
      puVar13 = puVar13 + 4;
    }
LAB_003a3832:
    VVar8 = (this->spxout).m_verbosity;
    if ((int)VVar8 < 3) {
      return false;
    }
    pSVar6 = &this->spxout;
    (this->spxout).m_verbosity = INFO1;
    pcVar10 = "Error parsing setting string: unknown parameter name <";
  }
  else {
    if (((*__s1 == 0x69) && (*pbVar12 == 0x6e)) && (pbVar12[1] == 0x74)) {
      puVar13 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 ::Settings::intParam;
      for (lVar11 = 0; lVar11 != 0x1c; lVar11 = lVar11 + 1) {
        iVar3 = strncmp((char *)__s1_00,(char *)*puVar13,500);
        if (iVar3 == 0) {
          std::__cxx11::string::string((string *)&local_250,(char *)__s1_01,&local_251);
          iVar3 = std::__cxx11::stoi(&local_250,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&local_250);
          bVar2 = setIntParam(this,(IntParam)lVar11,iVar3,false);
          if (bVar2) {
            return true;
          }
          VVar8 = (this->spxout).m_verbosity;
          if ((int)VVar8 < 3) {
            return false;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar6 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <")
          ;
          pSVar6 = soplex::operator<<(pSVar6,(char *)__s1_01);
          pcVar10 = "> for int parameter <";
          goto LAB_003a3ad2;
        }
        puVar13 = puVar13 + 4;
      }
      goto LAB_003a3832;
    }
    iVar3 = strncmp((char *)__s1,"real",4);
    if (iVar3 == 0) {
      puVar13 = &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 ::Settings::realParam;
      for (lVar11 = 0; lVar11 != 0x1b; lVar11 = lVar11 + 1) {
        iVar3 = strncmp((char *)__s1_00,(char *)*puVar13,500);
        if (iVar3 == 0) {
          std::__cxx11::string::string((string *)&local_250,(char *)__s1_01,&local_251);
          local_230 = std::__cxx11::stod(&local_250,(size_t *)0x0);
          std::__cxx11::string::~string((string *)&local_250);
          bVar2 = setRealParam(this,(RealParam)lVar11,local_230,true);
          if (bVar2) {
            return true;
          }
          VVar8 = (this->spxout).m_verbosity;
          if ((int)VVar8 < 3) {
            return false;
          }
          (this->spxout).m_verbosity = INFO1;
          pSVar6 = soplex::operator<<(&this->spxout,"Error parsing setting string: invalid value <")
          ;
          pSVar6 = soplex::operator<<(pSVar6,(char *)__s1_01);
          pcVar10 = "> for real parameter <";
          goto LAB_003a3ad2;
        }
        puVar13 = puVar13 + 4;
      }
      goto LAB_003a3832;
    }
    iVar3 = strncmp((char *)__s1,"uint",4);
    if (iVar3 == 0) {
      iVar3 = strncmp((char *)__s1_00,"random_seed",0xb);
      if (iVar3 == 0) {
        std::__cxx11::string::string((string *)&local_250,(char *)__s1_01,&local_251);
        uVar5 = std::__cxx11::stoul(&local_250,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_250);
        if (uVar5 >> 0x20 != 0) {
          VVar8 = (this->spxout).m_verbosity;
          uVar5 = 0xffffffffffffffff;
          if (0 < (int)VVar8) {
            (this->spxout).m_verbosity = WARNING;
            soplex::operator<<(&this->spxout,"Converting number greater than UINT_MAX to uint.\n");
            (this->spxout).m_verbosity = VVar8;
          }
        }
        Random::setSeed(&(this->_solver).random,(uint32_t)uVar5);
        return true;
      }
      VVar8 = (this->spxout).m_verbosity;
      if ((int)VVar8 < 3) {
        return false;
      }
      pSVar6 = &this->spxout;
      (this->spxout).m_verbosity = INFO1;
      pcVar10 = "Error parsing setting string for uint parameter <random_seed>.\n";
      goto LAB_003a35a0;
    }
    VVar8 = (this->spxout).m_verbosity;
    if ((int)VVar8 < 3) {
      return false;
    }
    (this->spxout).m_verbosity = INFO1;
    pSVar6 = soplex::operator<<(&this->spxout,
                                "Error parsing setting string: invalid parameter type <");
    pSVar6 = soplex::operator<<(pSVar6,(char *)__s1);
    pcVar10 = "> for parameter <";
  }
LAB_003a3ad2:
  pSVar6 = soplex::operator<<(pSVar6,pcVar10);
  pSVar6 = soplex::operator<<(pSVar6,(char *)__s1_00);
  pcVar10 = ">.\n";
LAB_003a35a0:
  soplex::operator<<(pSVar6,pcVar10);
  (this->spxout).m_verbosity = VVar8;
  return false;
}

Assistant:

bool SoPlexBase<R>::parseSettingsString(char* string)
{
   assert(string != nullptr);

   bool success = true;

   if(string == nullptr)
      return false;

   char parseString[SPX_SET_MAX_LINE_LEN];
   spxSnprintf(parseString, SPX_SET_MAX_LINE_LEN - 1, "%s", string);

   char* line = parseString;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing setting string: no ':' separating parameter type and name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter name.\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no '=' after parameter name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter value.\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: additional character '" << *line <<
                       "' after parameter value.\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a real parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;
#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for real parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << ">.\n");

   return false;
}